

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetIntegerVerifier::
verifyUnsignedIntegerGreaterOrEqual
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLuint reference)

{
  int pname;
  bool bVar1;
  qpTestResult qVar2;
  int *data;
  uint *puVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  uint local_1c0 [4];
  MessageBuilder local_1b0;
  undefined1 local_2c [8];
  StateQueryMemoryWriteGuard<int> state;
  GLuint reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetIntegerVerifier *this_local;
  
  state.m_value = reference;
  state.m_postguard = name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_2c);
  pname = state.m_postguard;
  data = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                   ((StateQueryMemoryWriteGuard<int> *)local_2c);
  glu::CallLogWrapper::glGetIntegerv(&(this->super_StateVerifier).super_CallLogWrapper,pname,data);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_2c,testCtx);
  if ((bVar1) &&
     (puVar3 = (uint *)deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                                 ((StateQueryMemoryWriteGuard *)local_2c),
     *puVar3 < (uint)state.m_value)) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [40])"// ERROR: expected greater or equal to ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)&state.m_value);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b7cef6);
    puVar3 = (uint *)deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                               ((StateQueryMemoryWriteGuard *)local_2c);
    local_1c0[0] = *puVar3;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c0);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyUnsignedIntegerGreaterOrEqual (tcu::TestContext& testCtx, GLenum name, GLuint reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint> state;
	glGetIntegerv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (GLuint(state) < reference)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected greater or equal to " << reference << "; got " << GLuint(state) << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}